

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O3

void plain_array_suite::assign_operator(void)

{
  ulong uVar1;
  basic_iterator<int> first_end;
  basic_iterator<int> first_end_00;
  basic_iterator<int> first_end_01;
  basic_iterator<int> first_end_02;
  basic_iterator<int> first_end_03;
  ulong uVar2;
  initializer_list<int> input;
  initializer_list<int> __l;
  initializer_list<int> input_00;
  initializer_list<int> __l_00;
  initializer_list<int> input_01;
  initializer_list<int> __l_01;
  initializer_list<int> input_02;
  initializer_list<int> __l_02;
  initializer_list<int> input_03;
  initializer_list<int> __l_03;
  basic_iterator<int> first_begin;
  basic_iterator<int> first_begin_00;
  basic_iterator<int> first_begin_01;
  basic_iterator<int> first_begin_02;
  basic_iterator<int> first_begin_03;
  vector<int,_std::allocator<int>_> expect;
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  allocator_type local_c9;
  vector<int,_std::allocator<int>_> local_c8;
  circular_view<int,_18446744073709551615UL> local_a8;
  int local_88 [4];
  circular_view<int,_18446744073709551615UL> *local_78;
  size_type sStack_70;
  circular_view<int,_18446744073709551615UL> *local_68;
  size_type sStack_60;
  circular_view<int,_18446744073709551615UL> *local_58;
  size_type sStack_50;
  circular_view<int,_18446744073709551615UL> *local_48;
  size_type sStack_40;
  circular_view<int,_18446744073709551615UL> *local_38;
  size_type sStack_30;
  type local_28 [4];
  
  local_a8.member.data = local_28;
  local_28[0] = 0;
  local_28[1] = 0;
  local_28[2] = 0;
  local_28[3] = 0;
  local_a8.member.cap = 4;
  local_a8.member.size = 0;
  local_a8.member.next = 4;
  local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,0xb);
  input._M_len = 1;
  input._M_array = (iterator)&local_c8;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_a8,input);
  local_88[0] = 0xb;
  __l._M_len = 1;
  __l._M_array = local_88;
  std::vector<int,_std::allocator<int>_>::vector(&local_c8,__l,&local_c9);
  uVar1 = local_a8.member.cap * 2;
  if ((uVar1 & local_a8.member.cap * 2 - 1) == 0) {
    uVar2 = local_a8.member.next - local_a8.member.size & uVar1 - 1;
    sStack_30 = uVar1 - 1 & local_a8.member.next;
  }
  else {
    uVar2 = (local_a8.member.next - local_a8.member.size) % uVar1;
    sStack_30 = local_a8.member.next % uVar1;
  }
  first_end.current = sStack_30;
  first_end.parent = &local_a8;
  first_begin.current = uVar2;
  first_begin.parent = &local_a8;
  local_38 = &local_a8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x730,"void plain_array_suite::assign_operator()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x1600000015;
  input_00._M_len = 2;
  input_00._M_array = (iterator)&local_c8;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_a8,input_00);
  local_88[0] = 0x15;
  local_88[1] = 0x16;
  __l_00._M_len = 2;
  __l_00._M_array = local_88;
  std::vector<int,_std::allocator<int>_>::vector(&local_c8,__l_00,&local_c9);
  uVar1 = local_a8.member.cap * 2;
  if ((uVar1 & local_a8.member.cap * 2 - 1) == 0) {
    uVar2 = local_a8.member.next - local_a8.member.size & uVar1 - 1;
    sStack_40 = uVar1 - 1 & local_a8.member.next;
  }
  else {
    uVar2 = (local_a8.member.next - local_a8.member.size) % uVar1;
    sStack_40 = local_a8.member.next % uVar1;
  }
  first_end_00.current = sStack_40;
  first_end_00.parent = &local_a8;
  first_begin_00.current = uVar2;
  first_begin_00.parent = &local_a8;
  local_48 = &local_a8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x736,"void plain_array_suite::assign_operator()",first_begin_00,first_end_00,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x200000001f;
  local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish._4_4_,0x21);
  input_01._M_len = 3;
  input_01._M_array = (iterator)&local_c8;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_a8,input_01);
  local_88[0] = 0x1f;
  local_88[1] = 0x20;
  local_88[2] = 0x21;
  __l_01._M_len = 3;
  __l_01._M_array = local_88;
  std::vector<int,_std::allocator<int>_>::vector(&local_c8,__l_01,&local_c9);
  uVar1 = local_a8.member.cap * 2;
  if ((uVar1 & local_a8.member.cap * 2 - 1) == 0) {
    uVar2 = local_a8.member.next - local_a8.member.size & uVar1 - 1;
    sStack_50 = uVar1 - 1 & local_a8.member.next;
  }
  else {
    uVar2 = (local_a8.member.next - local_a8.member.size) % uVar1;
    sStack_50 = local_a8.member.next % uVar1;
  }
  first_end_01.current = sStack_50;
  first_end_01.parent = &local_a8;
  first_begin_01.current = uVar2;
  first_begin_01.parent = &local_a8;
  local_58 = &local_a8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x73c,"void plain_array_suite::assign_operator()",first_begin_01,first_end_01,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x2a00000029;
  local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x2c0000002b;
  input_02._M_len = 4;
  input_02._M_array = (iterator)&local_c8;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_a8,input_02);
  local_88[0] = 0x29;
  local_88[1] = 0x2a;
  local_88[2] = 0x2b;
  local_88[3] = 0x2c;
  __l_02._M_len = 4;
  __l_02._M_array = local_88;
  std::vector<int,_std::allocator<int>_>::vector(&local_c8,__l_02,&local_c9);
  uVar1 = local_a8.member.cap * 2;
  if ((uVar1 & local_a8.member.cap * 2 - 1) == 0) {
    uVar2 = local_a8.member.next - local_a8.member.size & uVar1 - 1;
    sStack_60 = uVar1 - 1 & local_a8.member.next;
  }
  else {
    uVar2 = (local_a8.member.next - local_a8.member.size) % uVar1;
    sStack_60 = local_a8.member.next % uVar1;
  }
  first_end_02.current = sStack_60;
  first_end_02.parent = &local_a8;
  first_begin_02.current = uVar2;
  first_begin_02.parent = &local_a8;
  local_68 = &local_a8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x742,"void plain_array_suite::assign_operator()",first_begin_02,first_end_02,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x3400000033;
  local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x3600000035;
  local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0x37;
  input_03._M_len = 5;
  input_03._M_array = (iterator)&local_c8;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_a8,input_03);
  local_88[0] = 0x34;
  local_88[1] = 0x35;
  local_88[2] = 0x36;
  local_88[3] = 0x37;
  __l_03._M_len = 4;
  __l_03._M_array = local_88;
  std::vector<int,_std::allocator<int>_>::vector(&local_c8,__l_03,&local_c9);
  uVar1 = local_a8.member.cap * 2;
  if ((uVar1 & local_a8.member.cap * 2 - 1) == 0) {
    uVar2 = local_a8.member.next - local_a8.member.size & uVar1 - 1;
    sStack_70 = uVar1 - 1 & local_a8.member.next;
  }
  else {
    uVar2 = (local_a8.member.next - local_a8.member.size) % uVar1;
    sStack_70 = local_a8.member.next % uVar1;
  }
  first_end_03.current = sStack_70;
  first_end_03.parent = &local_a8;
  first_begin_03.current = uVar2;
  first_begin_03.parent = &local_a8;
  local_78 = &local_a8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x748,"void plain_array_suite::assign_operator()",first_begin_03,first_end_03,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void assign_operator()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11 };
    {
        std::vector<int> expect = { 11 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span = { 21, 22 };
    {
        std::vector<int> expect = { 21, 22 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span = { 31, 32, 33 };
    {
        std::vector<int> expect = { 31, 32, 33 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span = { 41, 42, 43, 44 };
    {
        std::vector<int> expect = { 41, 42, 43, 44 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span = { 51, 52, 53, 54, 55 };
    {
        std::vector<int> expect = { 52, 53, 54, 55 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}